

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack9_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x1ff;
  out[1] = *in >> 9 & 0x1ff;
  out[2] = *in >> 0x12 & 0x1ff;
  puVar1 = out + 3;
  *puVar1 = *in >> 0x1b;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0xf) << 5 | *puVar1;
  out[4] = *puVar2 >> 4 & 0x1ff;
  out[5] = *puVar2 >> 0xd & 0x1ff;
  out[6] = *puVar2 >> 0x16 & 0x1ff;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x1f;
  *puVar1 = (in[2] & 0xff) << 1 | *puVar1;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack9_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 9);
  out++;
  *out = ((*in) >> 9) % (1U << 9);
  out++;
  *out = ((*in) >> 18) % (1U << 9);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 4)) << (9 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 9);
  out++;
  *out = ((*in) >> 13) % (1U << 9);
  out++;
  *out = ((*in) >> 22) % (1U << 9);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 8)) << (9 - 8);
  out++;

  return in + 1;
}